

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<unsigned_long,block64>
               (block64 *key,int len,int maxlen,block64 *blocks,int blockcount,pfHash hash,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  char *pcVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  unsigned_long h;
  unsigned_long local_48;
  long local_40;
  block64 *local_38;
  
  if (0 < blockcount && len != maxlen) {
    lVar9 = 0;
    local_38 = key + len;
    local_40 = (ulong)(uint)blockcount << 6;
    do {
      pcVar1 = blocks->c + lVar9;
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      uVar4 = *(undefined8 *)(pcVar1 + 0x18);
      uVar5 = *(undefined8 *)(pcVar1 + 0x20);
      uVar6 = *(undefined8 *)(pcVar1 + 0x28);
      uVar7 = *(undefined8 *)(pcVar1 + 0x30);
      uVar8 = *(undefined8 *)(pcVar1 + 0x38);
      *(undefined8 *)local_38->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(local_38->c + 8) = uVar2;
      *(undefined8 *)(local_38->c + 0x10) = uVar3;
      *(undefined8 *)(local_38->c + 0x18) = uVar4;
      *(undefined8 *)(local_38->c + 0x20) = uVar5;
      *(undefined8 *)(local_38->c + 0x28) = uVar6;
      *(undefined8 *)(local_38->c + 0x30) = uVar7;
      *(undefined8 *)(local_38->c + 0x38) = uVar8;
      (*hash)(key,(len + 1) * 0x40,0,&local_48);
      __position._M_current =
           (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)hashes,__position,
                   &local_48);
      }
      else {
        *__position._M_current = local_48;
        (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      CombinationKeygenRecurse<unsigned_long,block64>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      lVar9 = lVar9 + 0x40;
    } while (local_40 != lVar9);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}